

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O1

ssize_t clickhouse::Poll(pollfd *fds,int nfds,int timeout)

{
  int iVar1;
  
  iVar1 = poll((pollfd *)fds,(long)nfds,timeout);
  return (long)iVar1;
}

Assistant:

ssize_t Poll(struct pollfd* fds, int nfds, int timeout) noexcept {
#if defined(_win_)
    int rval = WSAPoll(fds, nfds, timeout);
#else
    return poll(fds, nfds, timeout);
#endif
    return -1;
}